

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11::detail::clear_instance(PyObject *self)

{
  void ***this;
  PyObject *op;
  bool bVar1;
  value_and_holder *this_00;
  void **ppvVar2;
  undefined8 *puVar3;
  PyObject *_py_tmp;
  PyObject **dict_ptr;
  value_and_holder *v_h;
  iterator __end2;
  iterator __begin2;
  values_and_holders *__range2;
  instance *instance;
  PyObject *self_local;
  
  values_and_holders::values_and_holders((values_and_holders *)&__begin2.curr.vh,(instance *)self);
  this = &__begin2.curr.vh;
  values_and_holders::begin((iterator *)&__end2.curr.vh,(values_and_holders *)this);
  values_and_holders::end((iterator *)&v_h,(values_and_holders *)this);
  do {
    bVar1 = values_and_holders::iterator::operator!=((iterator *)&__end2.curr.vh,(iterator *)&v_h);
    if (!bVar1) {
      detail::instance::deallocate_layout((instance *)self);
      if (self[2].ob_type != (PyTypeObject *)0x0) {
        PyObject_ClearWeakRefs(self);
      }
      puVar3 = (undefined8 *)_PyObject_GetDictPtr(self);
      if ((puVar3 != (undefined8 *)0x0) && (op = (PyObject *)*puVar3, op != (PyObject *)0x0)) {
        *puVar3 = 0;
        _Py_DECREF(op);
      }
      if (((byte)self[3].ob_refcnt >> 4 & 1) != 0) {
        clear_patients(self);
      }
      return;
    }
    this_00 = values_and_holders::iterator::operator*((iterator *)&__end2.curr.vh);
    bVar1 = value_and_holder::operator_cast_to_bool(this_00);
    if (bVar1) {
      bVar1 = value_and_holder::instance_registered(this_00);
      if (bVar1) {
        ppvVar2 = value_and_holder::value_ptr<void>(this_00);
        bVar1 = deregister_instance((instance *)self,*ppvVar2,this_00->type);
        if (!bVar1) {
          pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");
        }
      }
      if (((self[3].ob_refcnt & 1) != 0) ||
         (bVar1 = value_and_holder::holder_constructed(this_00), bVar1)) {
        (*this_00->type->dealloc)(this_00);
      }
    }
    values_and_holders::iterator::operator++((iterator *)&__end2.curr.vh);
  } while( true );
}

Assistant:

inline void clear_instance(PyObject *self) {
    auto instance = reinterpret_cast<detail::instance *>(self);

    // Deallocate any values/holders, if present:
    for (auto &v_h : values_and_holders(instance)) {
        if (v_h) {

            // We have to deregister before we call dealloc because, for virtual MI types, we still
            // need to be able to get the parent pointers.
            if (v_h.instance_registered() && !deregister_instance(instance, v_h.value_ptr(), v_h.type))
                pybind11_fail("pybind11_object_dealloc(): Tried to deallocate unregistered instance!");

            if (instance->owned || v_h.holder_constructed())
                v_h.type->dealloc(v_h);
        }
    }
    // Deallocate the value/holder layout internals:
    instance->deallocate_layout();

    if (instance->weakrefs)
        PyObject_ClearWeakRefs(self);

    PyObject **dict_ptr = _PyObject_GetDictPtr(self);
    if (dict_ptr)
        Py_CLEAR(*dict_ptr);

    if (instance->has_patients)
        clear_patients(self);
}